

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * replaceArgEscapes(QStringView s,ArgEscapeData *d,qsizetype field_width,QStringView arg,
                           QStringView larg,QChar fillChar)

{
  const_iterator __src;
  const_iterator pvVar1;
  char16_t cVar2;
  int iVar3;
  const_iterator pvVar4;
  qsizetype qVar5;
  int *in_RCX;
  QString *in_RDI;
  long in_R8;
  long in_FS_OFFSET;
  qsizetype pad_chars;
  int digit;
  int escape;
  bool localize;
  QChar *escape_start;
  QChar *text_start;
  QChar *uc_end;
  QChar *c;
  qsizetype repl_cnt;
  QChar *result_end;
  QChar *rc;
  qsizetype result_len;
  QString *result;
  QStringView use;
  qsizetype abs_field_width;
  QStringView *in_stack_fffffffffffffeb0;
  QChar *in_stack_fffffffffffffeb8;
  const_pointer in_stack_fffffffffffffec8;
  QChar *in_stack_fffffffffffffed0;
  QString *in_stack_fffffffffffffed8;
  QChar *pQVar6;
  QStringView *local_120;
  int local_b8;
  const_iterator local_98;
  long local_90;
  QChar *local_80;
  QStringView local_58;
  char16_t local_44;
  char16_t local_42;
  qsizetype local_40;
  qsizetype local_38;
  QChar *local_30;
  long local_28 [2];
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28[0] = in_R8;
  local_30 = (QChar *)qAbs<long_long>(local_28);
  QStringView::size(&local_18);
  local_38 = QStringView::size((QStringView *)&stack0x00000008);
  qMax<long_long>((longlong *)&local_30,&local_38);
  local_40 = QStringView::size((QStringView *)&stack0x00000018);
  qMax<long_long>((longlong *)&local_30,&local_40);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString(in_stack_fffffffffffffed8,(qsizetype)in_stack_fffffffffffffed0,
                   (Initialization)((ulong)in_stack_fffffffffffffec8 >> 0x20));
  local_80 = QString::unicode((QString *)0x51ba6d);
  local_90 = 0;
  local_98 = QStringView::begin((QStringView *)0x51baac);
  pvVar4 = QStringView::end(in_stack_fffffffffffffeb0);
  while (__src = local_98, local_98 != pvVar4) {
    while (pvVar1 = local_98, cVar2 = QChar::unicode(local_98), cVar2 != L'%') {
      local_98 = local_98 + 1;
    }
    cVar2 = QChar::unicode(local_98 + 1);
    pQVar6 = local_98 + 1;
    if (cVar2 == L'L') {
      pQVar6 = local_98 + 2;
    }
    local_98 = pQVar6;
    local_42 = local_98->ucs;
    local_b8 = qArgDigitValue((QChar)(char16_t)((ulong)in_stack_fffffffffffffeb8 >> 0x30));
    if ((local_b8 != -1) && (local_98 + 1 != pvVar4)) {
      local_44 = local_98[1].ucs;
      iVar3 = qArgDigitValue((QChar)(char16_t)((ulong)in_stack_fffffffffffffeb8 >> 0x30));
      if (iVar3 != -1) {
        local_98 = local_98 + 1;
        local_b8 = local_b8 * 10 + iVar3;
      }
    }
    if (local_b8 == *in_RCX) {
      local_98 = local_98 + 1;
      memcpy(local_80,__src,((long)pvVar1 - (long)__src >> 1) << 1);
      local_80 = local_80 + ((long)pvVar1 - (long)__src >> 1);
      local_120 = (QStringView *)&stack0x00000008;
      if (cVar2 == L'L') {
        local_120 = (QStringView *)&stack0x00000018;
      }
      local_58.m_size = local_120->m_size;
      local_58.m_data = local_120->m_data;
      pQVar6 = local_30;
      QStringView::size(&local_58);
      if (0 < local_28[0]) {
        in_stack_fffffffffffffed0 =
             std::fill_n<QChar*,long_long,QChar>
                       (pQVar6,(longlong)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        local_80 = in_stack_fffffffffffffed0;
      }
      qVar5 = QStringView::size(&local_58);
      if (qVar5 != 0) {
        in_stack_fffffffffffffec8 = QStringView::data(&local_58);
        qVar5 = QStringView::size(&local_58);
        memcpy(local_80,in_stack_fffffffffffffec8,qVar5 << 1);
      }
      qVar5 = QStringView::size(&local_58);
      local_80 = local_80 + qVar5;
      if (local_28[0] < 0) {
        in_stack_fffffffffffffeb8 =
             std::fill_n<QChar*,long_long,QChar>
                       (pQVar6,(longlong)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        local_80 = in_stack_fffffffffffffeb8;
      }
      local_90 = local_90 + 1;
      if (local_90 == *(long *)(in_RCX + 2)) {
        memcpy(local_80,local_98,((long)pvVar4 - (long)local_98 >> 1) << 1);
        local_80 = local_80 + ((long)pvVar4 - (long)local_98 >> 1);
        local_98 = pvVar4;
      }
    }
    else {
      memcpy(local_80,__src,((long)local_98 - (long)__src >> 1) << 1);
      local_80 = local_80 + ((long)local_98 - (long)__src >> 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QString replaceArgEscapes(QStringView s, const ArgEscapeData &d, qsizetype field_width,
                                 QStringView arg, QStringView larg, QChar fillChar)
{
    // Negative field-width for right-padding, positive for left-padding:
    const qsizetype abs_field_width = qAbs(field_width);
    const qsizetype result_len =
            s.size() - d.escape_len
            + (d.occurrences - d.locale_occurrences) * qMax(abs_field_width, arg.size())
            + d.locale_occurrences * qMax(abs_field_width, larg.size());

    QString result(result_len, Qt::Uninitialized);
    QChar *rc = const_cast<QChar *>(result.unicode());
    QChar *const result_end = rc + result_len;
    qsizetype repl_cnt = 0;

    const QChar *c = s.begin();
    const QChar *const uc_end = s.end();
    while (c != uc_end) {
        Q_ASSERT(d.occurrences > repl_cnt);
        /* We don't have to check increments of c against uc_end because, as
           long as d.occurrences > repl_cnt, we KNOW there are valid escape
           sequences remaining. */

        const QChar *text_start = c;
        while (c->unicode() != '%')
            ++c;

        const QChar *escape_start = c++;
        const bool localize = c->unicode() == 'L';
        if (localize)
            ++c;

        int escape = qArgDigitValue(*c);
        if (escape != -1 && c + 1 != uc_end) {
            const int digit = qArgDigitValue(c[1]);
            if (digit != -1) {
                ++c;
                escape = 10 * escape + digit;
            }
        }

        if (escape != d.min_escape) {
            memcpy(rc, text_start, (c - text_start) * sizeof(QChar));
            rc += c - text_start;
        } else {
            ++c;

            memcpy(rc, text_start, (escape_start - text_start) * sizeof(QChar));
            rc += escape_start - text_start;

            const QStringView use = localize ? larg : arg;
            const qsizetype pad_chars = abs_field_width - use.size();
            // (If negative, relevant loops are no-ops: no need to check.)

            if (field_width > 0) { // left padded
                rc = std::fill_n(rc, pad_chars, fillChar);
            }

            if (use.size())
                memcpy(rc, use.data(), use.size() * sizeof(QChar));
            rc += use.size();

            if (field_width < 0) { // right padded
                rc = std::fill_n(rc, pad_chars, fillChar);
            }

            if (++repl_cnt == d.occurrences) {
                memcpy(rc, c, (uc_end - c) * sizeof(QChar));
                rc += uc_end - c;
                Q_ASSERT(rc == result_end);
                c = uc_end;
            }
        }
    }
    Q_ASSERT(rc == result_end);

    return result;
}